

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool set_dic_path(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  char temp [260];
  char temp2 [260];
  char local_238 [272];
  char local_128 [264];
  
  if (oj != (OpenJTalk *)0x0) {
    memset(local_238,0,0x104);
    if (path == (char *)0x0) {
      return false;
    }
    if (*path != '\0') {
      _Var1 = is_relative(path);
      if (!_Var1) {
        strcpy(local_238,path);
        _Var1 = exists_dir(local_238);
        if (!_Var1) {
          return false;
        }
        if (local_238[0] == '\0') {
          return false;
        }
LAB_00149170:
        strcpy(oj->dn_dic_path,local_238);
        Open_JTalk_load_dic(oj->open_jtalk,local_238);
        return true;
      }
      sVar2 = strlen(g_current_path);
      if ((sVar2 != 0) && (sVar3 = strlen(path), 0xfffffffffffffefa < (sVar3 + sVar2) - 0x103)) {
        strcpy(local_128,g_current_path);
        strcat(local_128,G_SLASH_CHAR);
        strcat(local_128,path);
        _Var1 = exists_dir(local_128);
        if ((_Var1) && (get_fullpath(local_128,local_238), local_238[0] != '\0')) goto LAB_00149170;
      }
    }
  }
  return false;
}

Assistant:

bool set_dic_path(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	if (path != NULL && strlen(path) != 0)
	{
		// パスが絶対指定ならば
		if (!is_relative(path))
		{
			strcpy(temp, path);
			if (exists_dir(temp))
			{
				goto check_charset;
			}
		}
		// パスが相対指定ならば
		else
		{
			// カレントフォルダを探す
			if (g_current_path != NULL && strlen(g_current_path) != 0)
			{

				if (strlen(g_current_path) + 1 + strlen(path) + 1 > MAX_PATH)
				{
					return false;
				}

				char temp2[MAX_PATH];
				strcpy(temp2, g_current_path);
				strcat(temp2, G_SLASH_CHAR);
				strcat(temp2, path);

				if (exists_dir(temp2))
				{
					get_fullpath(temp2, temp);
					goto check_charset;
				}
			}
		}
	}
	return false;

check_charset:
	if (!*temp)
	{
		return false;
	}
	strcpy(oj->dn_dic_path, temp);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(temp, temp2);
	Open_JTalk_load_dic(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_dic(oj->open_jtalk, temp);
#endif
	return true;
}